

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O0

void __thiscall kratos::PortVisitor::visit(PortVisitor *this,Port *port)

{
  undefined1 local_28 [24];
  Port *port_local;
  PortVisitor *this_local;
  
  local_28._16_8_ = port;
  port_local = (Port *)this;
  Var::as<kratos::Port>((Var *)local_28);
  std::
  unordered_set<std::shared_ptr<kratos::Port>,std::hash<std::shared_ptr<kratos::Port>>,std::equal_to<std::shared_ptr<kratos::Port>>,std::allocator<std::shared_ptr<kratos::Port>>>
  ::emplace<std::shared_ptr<kratos::Port>>
            ((unordered_set<std::shared_ptr<kratos::Port>,std::hash<std::shared_ptr<kratos::Port>>,std::equal_to<std::shared_ptr<kratos::Port>>,std::allocator<std::shared_ptr<kratos::Port>>>
              *)&this->ports,(shared_ptr<kratos::Port> *)local_28);
  std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)local_28);
  return;
}

Assistant:

void visit(Port* port) override { ports.emplace(port->as<Port>()); }